

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_DEVICE_TWIN *
dev_twin_data_create
          (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData,uint32_t id,uchar *reportedState,
          size_t size,IOTHUB_CLIENT_REPORTED_STATE_CALLBACK reportedStateCallback,
          void *userContextCallback)

{
  CONSTBUFFER_HANDLE pCVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_DEVICE_TWIN *result;
  void *userContextCallback_local;
  IOTHUB_CLIENT_REPORTED_STATE_CALLBACK reportedStateCallback_local;
  size_t size_local;
  uchar *reportedState_local;
  uint32_t id_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData_local;
  
  l = (LOGGER_LOG)malloc(0x48);
  if (l == (LOGGER_LOG)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"dev_twin_data_create",0x4d7,1,"Failure allocating device twin information");
    }
  }
  else {
    pCVar1 = CONSTBUFFER_Create(reportedState,size);
    *(CONSTBUFFER_HANDLE *)(l + 0x18) = pCVar1;
    if (*(long *)(l + 0x18) == 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"dev_twin_data_create",0x4c7,1,"Failure allocating reported state data");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      *(uint32_t *)l = id;
      *(undefined8 *)(l + 8) = 0;
      *(void **)(l + 0x20) = userContextCallback;
      *(IOTHUB_CLIENT_REPORTED_STATE_CALLBACK *)(l + 0x10) = reportedStateCallback;
      *(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA **)(l + 0x38) = handleData;
      *(IOTHUB_DEVICE_HANDLE *)(l + 0x40) = handleData->deviceHandle;
    }
  }
  return (IOTHUB_DEVICE_TWIN *)l;
}

Assistant:

static IOTHUB_DEVICE_TWIN* dev_twin_data_create(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData, uint32_t id, const unsigned char* reportedState, size_t size, IOTHUB_CLIENT_REPORTED_STATE_CALLBACK reportedStateCallback, void* userContextCallback)
{
    IOTHUB_DEVICE_TWIN* result = (IOTHUB_DEVICE_TWIN*)malloc(sizeof(IOTHUB_DEVICE_TWIN) );
    if (result != NULL)
    {
        result->report_data_handle = CONSTBUFFER_Create(reportedState, size);
        if (result->report_data_handle == NULL)
        {
            LogError("Failure allocating reported state data");
            free(result);
            result = NULL;
        }
        else
        {
            result->item_id = id;
            result->ms_timesOutAfter = 0;
            result->context = userContextCallback;
            result->reported_state_callback = reportedStateCallback;
            result->client_handle = handleData;
            result->device_handle = handleData->deviceHandle;
        }
    }
    else
    {
        LogError("Failure allocating device twin information");
    }
    return result;
}